

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

string * duckdb::StringUtil::CandidatesMessage
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   *candidates,string *candidate)

{
  long *plVar1;
  const_reference __rhs;
  undefined8 *puVar2;
  long *plVar3;
  size_type __n;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((candidates->
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (candidates->
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::operator+(&local_58,anon_var_dwarf_63f1717 + 8,candidate);
    plVar1 = (long *)::std::__cxx11::string::append((char *)&local_58);
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_68 = *plVar3;
      lStack_60 = plVar1[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar3;
      local_78 = (long *)*plVar1;
    }
    local_70 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((candidates->
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (candidates->
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        if (__n != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        __rhs = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](candidates,__n);
        ::std::operator+(&local_58,"\"",__rhs);
        puVar2 = (undefined8 *)::std::__cxx11::string::append((char *)&local_58);
        plVar1 = puVar2 + 2;
        if ((long *)*puVar2 == plVar1) {
          local_68 = *plVar1;
          lStack_60 = puVar2[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *plVar1;
          local_78 = (long *)*puVar2;
        }
        local_70 = puVar2[1];
        *puVar2 = plVar1;
        puVar2[1] = 0;
        *(undefined1 *)(puVar2 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
        if (local_78 != &local_68) {
          operator_delete(local_78);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(candidates->
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(candidates->
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::CandidatesMessage(const vector<string> &candidates, const string &candidate) {
	string result_str;
	if (!candidates.empty()) {
		result_str = "\n" + candidate + ": ";
		for (idx_t i = 0; i < candidates.size(); i++) {
			if (i > 0) {
				result_str += ", ";
			}
			result_str += "\"" + candidates[i] + "\"";
		}
	}
	return result_str;
}